

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O1

int mg_start_thread(mg_thread_func_t func,void *param)

{
  int iVar1;
  pthread_t thread_id;
  pthread_attr_t attr;
  pthread_t pStack_58;
  pthread_attr_t local_50;
  
  pthread_attr_init(&local_50);
  pthread_attr_setdetachstate(&local_50,1);
  iVar1 = pthread_create(&pStack_58,&local_50,(__start_routine *)func,param);
  pthread_attr_destroy(&local_50);
  return iVar1;
}

Assistant:

CIVETWEB_API int
mg_start_thread(mg_thread_func_t func, void *param)
{
	pthread_t thread_id;
	pthread_attr_t attr;
	int result;

	(void)pthread_attr_init(&attr);
	(void)pthread_attr_setdetachstate(&attr, PTHREAD_CREATE_DETACHED);

#if defined(__ZEPHYR__)
	pthread_attr_setstack(&attr, &civetweb_main_stack, ZEPHYR_STACK_SIZE);
#elif defined(USE_STACK_SIZE) && (USE_STACK_SIZE > 1)
	/* Compile-time option to control stack size,
	 * e.g. -DUSE_STACK_SIZE=16384 */
	(void)pthread_attr_setstacksize(&attr, USE_STACK_SIZE);
#endif /* defined(USE_STACK_SIZE) && (USE_STACK_SIZE > 1) */

	result = pthread_create(&thread_id, &attr, func, param);
	pthread_attr_destroy(&attr);

	return result;
}